

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O0

void __thiscall
SourceMapTest_SourceMappingSingleSegment_Test::TestBody
          (SourceMapTest_SourceMappingSingleSegment_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_a8;
  AssertHelper local_88;
  Message local_80;
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  optional<wasm::Function::DebugLocation> loc;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string sourceMap;
  SourceMapTest_SourceMappingSingleSegment_Test *this_local;
  
  sourceMap.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "\n      {\n          \"version\": 3,\n          \"sources\": [],\n          \"sourcesContent\": [],\n          \"names\": [],\n          \"mappings\": \"A\"\n      }\n  "
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  SourceMapTest::parseMap(&this->super_SourceMapTest,(string *)local_30);
  std::unique_ptr<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>::operator->
            (&(this->super_SourceMapTest).reader);
  ::wasm::SourceMapReader::readDebugLocationAt
            ((ulong)((long)&gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_71 = std::optional<wasm::Function::DebugLocation>::has_value
                       ((optional<wasm::Function::DebugLocation> *)
                        ((long)&gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 4));
  local_71 = !local_71;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)local_70,(AssertionResult *)"loc.has_value()","true","false",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0x54,message);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(SourceMapTest, SourceMappingSingleSegment) {
  // A single-segment mapping starting at offset 0.
  std::string sourceMap = R"(
      {
          "version": 3,
          "sources": [],
          "sourcesContent": [],
          "names": [],
          "mappings": "A"
      }
  )";
  parseMap(sourceMap);

  auto loc = reader->readDebugLocationAt(0);
  EXPECT_FALSE(loc.has_value());
}